

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::Add(TableBuilder *this,Slice *key,Slice *value)

{
  Comparator *pCVar1;
  Slice *pSVar2;
  bool bVar3;
  int iVar4;
  BlockBuilder *this_00;
  string *psVar5;
  char *pcVar6;
  size_t sVar7;
  size_t estimated_block_size;
  Slice local_78 [2];
  string local_58 [8];
  string handle_encoding;
  Slice local_38;
  Rep *local_28;
  Rep *r;
  Slice *value_local;
  Slice *key_local;
  TableBuilder *this_local;
  
  local_28 = this->rep_;
  r = (Rep *)value;
  value_local = key;
  key_local = (Slice *)this;
  if (((local_28->closed ^ 0xffU) & 1) == 0) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                  ,0x60,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
  }
  bVar3 = ok(this);
  pSVar2 = value_local;
  if (bVar3) {
    if (0 < local_28->num_entries) {
      pCVar1 = (local_28->options).comparator;
      Slice::Slice(&local_38,&local_28->last_key);
      iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,pSVar2,&local_38);
      if (iVar4 < 1) {
        __assert_fail("r->options.comparator->Compare(key, Slice(r->last_key)) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                      ,99,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
      }
    }
    if ((local_28->pending_index_entry & 1U) != 0) {
      bVar3 = BlockBuilder::empty(&local_28->data_block);
      if (!bVar3) {
        __assert_fail("r->data_block.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                      ,0x67,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
      }
      pCVar1 = (local_28->options).comparator;
      (*pCVar1->_vptr_Comparator[4])(pCVar1,&local_28->last_key,value_local);
      std::__cxx11::string::string(local_58);
      BlockHandle::EncodeTo(&local_28->pending_handle,(string *)local_58);
      this_00 = &local_28->index_block;
      Slice::Slice(local_78,&local_28->last_key);
      Slice::Slice((Slice *)&estimated_block_size,(string *)local_58);
      BlockBuilder::Add(this_00,local_78,(Slice *)&estimated_block_size);
      local_28->pending_index_entry = false;
      std::__cxx11::string::~string(local_58);
    }
    if (local_28->filter_block != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::AddKey(local_28->filter_block,value_local);
    }
    psVar5 = &local_28->last_key;
    pcVar6 = Slice::data(value_local);
    Slice::size(value_local);
    std::__cxx11::string::assign((char *)psVar5,(ulong)pcVar6);
    local_28->num_entries = local_28->num_entries + 1;
    BlockBuilder::Add(&local_28->data_block,value_local,(Slice *)r);
    sVar7 = BlockBuilder::CurrentSizeEstimate(&local_28->data_block);
    if ((local_28->options).block_size <= sVar7) {
      Flush(this);
    }
  }
  return;
}

Assistant:

void TableBuilder::Add(const Slice& key, const Slice& value) {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->num_entries > 0) {
    assert(r->options.comparator->Compare(key, Slice(r->last_key)) > 0);
  }

  if (r->pending_index_entry) {
    assert(r->data_block.empty());
    r->options.comparator->FindShortestSeparator(&r->last_key, key);
    std::string handle_encoding;
    r->pending_handle.EncodeTo(&handle_encoding);
    r->index_block.Add(r->last_key, Slice(handle_encoding));
    r->pending_index_entry = false;
  }

  if (r->filter_block != nullptr) {
    r->filter_block->AddKey(key);
  }

  r->last_key.assign(key.data(), key.size());
  r->num_entries++;
  r->data_block.Add(key, value);

  const size_t estimated_block_size = r->data_block.CurrentSizeEstimate();
  if (estimated_block_size >= r->options.block_size) {
    Flush();
  }
}